

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uhttp.c
# Opt level: O0

int send_http_data(HTTP_CLIENT_HANDLE_DATA *http_data,HTTP_CLIENT_REQUEST_TYPE request_type,
                  char *relative_path,STRING_HANDLE http_line)

{
  int iVar1;
  STRING_HANDLE handle;
  LOGGER_LOG p_Var2;
  char *text_line;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  STRING_HANDLE transmit_data;
  int result;
  STRING_HANDLE http_line_local;
  char *relative_path_local;
  HTTP_CLIENT_REQUEST_TYPE request_type_local;
  HTTP_CLIENT_HANDLE_DATA *http_data_local;
  
  handle = construct_http_data(request_type,relative_path,http_line);
  if (handle == (STRING_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                ,"send_http_data",0x41d,1,"Failure constructing http data");
    }
    transmit_data._4_4_ = 0x41e;
  }
  else {
    text_line = STRING_c_str(handle);
    iVar1 = write_text_line(http_data,text_line);
    if (iVar1 == 0) {
      transmit_data._4_4_ = 0;
    }
    else {
      transmit_data._4_4_ = 0x425;
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uhttp-c/src/uhttp.c"
                  ,"send_http_data",0x426,1,"Failure writing request buffer");
      }
    }
    STRING_delete(handle);
  }
  return transmit_data._4_4_;
}

Assistant:

static int send_http_data(HTTP_CLIENT_HANDLE_DATA* http_data, HTTP_CLIENT_REQUEST_TYPE request_type, const char* relative_path,
    STRING_HANDLE http_line)
{
    int result;
    STRING_HANDLE transmit_data = construct_http_data(request_type, relative_path, http_line);
    if (transmit_data == NULL)
    {
        LogError("Failure constructing http data");
        result = MU_FAILURE;
    }
    else
    {
        /* Tests_SRS_UHTTP_07_016: [http_client_execute_request shall transmit the http headers data through a call to xio_send;]*/
        if (write_text_line(http_data, STRING_c_str(transmit_data) ) != 0)
        {
            result = MU_FAILURE;
            LogError("Failure writing request buffer");
        }
        else
        {
            result = 0;
        }
        STRING_delete(transmit_data);
    }
    return result;
}